

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O1

_Bool binary_fuse16_populate(uint64_t *keys,uint32_t size,binary_fuse16_t *filter)

{
  ulong *puVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint16_t *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  byte bVar9;
  int iVar10;
  void *__s;
  void *__ptr;
  void *__s_00;
  void *__ptr_00;
  void *__s_01;
  void *__ptr_01;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  _Bool _Var14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  byte bVar24;
  uint32_t i;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uint32_t h012 [5];
  ulong local_f8;
  uint local_d8 [4];
  uint local_c8;
  ulong local_c0;
  binary_fuse16_t *local_b8;
  ulong local_b0;
  ulong local_a8;
  int local_9c;
  void *local_98;
  uint64_t *local_90;
  ulong local_88;
  size_t local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  undefined1 local_48 [16];
  
  if (filter->Size != size) {
    return false;
  }
  local_f8 = (ulong)size;
  filter->Seed = 0x6df6b22537d23467;
  local_90 = keys;
  __s = calloc((ulong)(size + 1),8);
  uVar13 = (ulong)filter->ArrayLength;
  __ptr = malloc(uVar13 * 4);
  __s_00 = calloc(uVar13,1);
  __ptr_00 = malloc(local_f8);
  local_c0 = uVar13;
  __s_01 = calloc(uVar13,8);
  local_a8 = 0xffffffc0;
  do {
    uVar27 = 1 << ((char)local_a8 + 0x41U & 0x1f);
    local_a8 = (ulong)((int)local_a8 + 1);
  } while (uVar27 < filter->SegmentCount);
  uVar13 = (ulong)uVar27;
  local_b8 = filter;
  __ptr_01 = malloc(uVar13 * 4);
  auVar29._0_4_ = -(uint)((int)((ulong)__ptr >> 0x20) == 0 && (int)__ptr == 0);
  auVar29._4_4_ = -(uint)((int)__s_00 == 0 && (int)((ulong)__s_00 >> 0x20) == 0);
  auVar29._8_4_ = -(uint)((int)((ulong)__ptr_00 >> 0x20) == 0 && (int)__ptr_00 == 0);
  auVar29._12_4_ = -(uint)((int)__s_01 == 0 && (int)((ulong)__s_01 >> 0x20) == 0);
  iVar10 = movmskps((int)__ptr_01,auVar29);
  _Var14 = false;
  if (((iVar10 == 0) && (_Var14 = false, __s != (void *)0x0)) &&
     (_Var14 = false, __ptr_01 != (void *)0x0)) {
    *(undefined8 *)((long)__s + local_f8 * 8) = 1;
    local_70 = (ulong)((int)local_a8 + 0x40);
    local_a8 = (ulong)(uint)-(int)local_a8;
    local_78 = uVar13 + 1 & 0xfffffffffffffffe;
    lVar25 = uVar13 - 1;
    auVar31._8_4_ = (int)lVar25;
    auVar31._0_8_ = lVar25;
    auVar31._12_4_ = (int)((ulong)lVar25 >> 0x20);
    local_80 = local_c0 * 8;
    local_88 = 0x10a2a556c2d61962;
    auVar31 = auVar31 ^ _DAT_00107060;
    iVar10 = 1;
    local_98 = __ptr;
    local_48 = auVar31;
    auVar29 = _DAT_00107060;
    do {
      uVar13 = local_f8 & 0xffffffff;
      uVar16 = 0;
      uVar20 = 0;
      auVar28 = _DAT_00107050;
      do {
        auVar30 = auVar28 ^ auVar29;
        if ((bool)(~(auVar30._4_4_ == auVar31._4_4_ && auVar31._0_4_ < auVar30._0_4_ ||
                    auVar31._4_4_ < auVar30._4_4_) & 1)) {
          *(int *)((long)__ptr_01 + uVar20 * 4) = (int)(uVar16 >> ((byte)local_70 & 0x3f));
        }
        if ((auVar30._12_4_ != auVar31._12_4_ || auVar30._8_4_ <= auVar31._8_4_) &&
            auVar30._12_4_ <= auVar31._12_4_) {
          *(int *)((long)__ptr_01 + uVar20 * 4 + 4) =
               (int)(uVar13 + uVar16 >> ((byte)local_70 & 0x3f));
        }
        uVar20 = uVar20 + 2;
        lVar25 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + 2;
        auVar28._8_8_ = lVar25 + 2;
        uVar16 = uVar16 + uVar13 * 2;
      } while (local_78 != uVar20);
      local_9c = iVar10;
      if ((int)local_f8 == 0) {
        bVar8 = true;
        local_b0 = 0;
      }
      else {
        uVar3 = local_b8->Seed;
        uVar16 = 0;
        do {
          uVar20 = local_90[uVar16] + uVar3;
          uVar20 = (uVar20 >> 0x21 ^ uVar20) * -0xae502812aa7333;
          uVar20 = (uVar20 >> 0x21 ^ uVar20) * -0x3b314601e57a13ad;
          uVar20 = uVar20 >> 0x21 ^ uVar20;
          uVar21 = uVar20 >> ((byte)local_a8 & 0x3f);
          while( true ) {
            uVar22 = *(uint *)((long)__ptr_01 + uVar21 * 4);
            if (*(long *)((long)__s + (ulong)uVar22 * 8) == 0) break;
            uVar21 = (ulong)((int)uVar21 + 1U & uVar27 - 1);
          }
          *(ulong *)((long)__s + (ulong)uVar22 * 8) = uVar20;
          *(uint *)((long)__ptr_01 + uVar21 * 4) = uVar22 + 1;
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar13);
        uVar22 = local_b8->SegmentLength;
        uVar23 = local_b8->SegmentLengthMask;
        local_58 = (ulong)uVar23;
        local_50 = (ulong)uVar22;
        local_60 = (ulong)uVar22 * 2;
        uVar16 = 0;
        local_68 = CONCAT44(0,local_b8->SegmentCountLength);
        bVar8 = false;
        local_b0 = 0;
        do {
          uVar20 = *(ulong *)((long)__s + uVar16 * 8);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = local_68;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar20;
          lVar25 = SUB168(auVar30 * auVar5,8);
          *(char *)((long)__s_00 + lVar25) = *(char *)((long)__s_00 + lVar25) + '\x04';
          puVar1 = (ulong *)((long)__s_01 + lVar25 * 8);
          *puVar1 = *puVar1 ^ uVar20;
          iVar10 = SUB164(auVar30 * auVar5,8);
          uVar11 = (ulong)((uint)(uVar20 >> 0x12) & uVar23 & 0x3ffff ^ iVar10 + uVar22);
          bVar18 = *(byte *)((long)__s_00 + uVar11);
          puVar1 = (ulong *)((long)__s_01 + uVar11 * 8);
          *puVar1 = *puVar1 ^ uVar20;
          *(byte *)((long)__s_00 + uVar11) = (bVar18 ^ 1) + 4;
          uVar26 = (ulong)((uint)uVar20 & uVar23 ^ (int)local_60 + iVar10);
          bVar18 = *(char *)((long)__s_00 + uVar26) + 4;
          *(byte *)((long)__s_00 + uVar26) = bVar18;
          uVar21 = *(ulong *)((long)__s_01 + uVar26 * 8);
          uVar15 = uVar21 ^ uVar20;
          *(ulong *)((long)__s_01 + uVar26 * 8) = uVar15;
          *(byte *)((long)__s_00 + uVar26) = bVar18 ^ 2;
          uVar12 = *(ulong *)((long)__s_01 + lVar25 * 8);
          uVar17 = *(ulong *)((long)__s_01 + uVar11 * 8);
          if (((uVar15 & uVar12 & uVar17) == 0) &&
             ((((uVar12 == 0 && (*(char *)((long)__s_00 + lVar25) == '\b')) ||
               ((uVar17 == 0 && (*(char *)((long)__s_00 + uVar11) == '\b')))) ||
              ((uVar21 == uVar20 && (bVar18 == 10)))))) {
            local_b0 = (ulong)((int)local_b0 + 1);
            *(char *)((long)__s_00 + lVar25) = *(char *)((long)__s_00 + lVar25) + -4;
            *(ulong *)((long)__s_01 + lVar25 * 8) = uVar12 ^ uVar20;
            bVar18 = *(byte *)((long)__s_00 + uVar11);
            puVar1 = (ulong *)((long)__s_01 + uVar11 * 8);
            *puVar1 = *puVar1 ^ uVar20;
            *(byte *)((long)__s_00 + uVar11) = (bVar18 ^ 1) - 4;
            *(byte *)((long)__s_00 + uVar26) = (*(byte *)((long)__s_00 + uVar26) ^ 2) - 4;
            puVar1 = (ulong *)((long)__s_01 + uVar26 * 8);
            *puVar1 = *puVar1 ^ uVar20;
          }
          if (*(byte *)((long)__s_00 + lVar25) < 4) {
            bVar8 = true;
          }
          if (*(byte *)((long)__s_00 + uVar11) < 4) {
            bVar8 = true;
          }
          if (*(byte *)((long)__s_00 + uVar26) < 4) {
            bVar8 = true;
          }
          uVar16 = uVar16 + 1;
        } while (uVar13 != uVar16);
        bVar8 = !bVar8;
        __ptr = local_98;
      }
      iVar10 = 6;
      if (bVar8) {
        uVar16 = 0;
        uVar20 = 0;
        if (local_c0 != 0) {
          uVar21 = 0;
          uVar22 = 0;
          do {
            *(int *)((long)__ptr + (ulong)uVar22 * 4) = (int)uVar21;
            uVar22 = ((*(byte *)((long)__s_00 + uVar21) & 0xfc) == 4) + uVar22;
            uVar20 = (ulong)uVar22;
            uVar21 = uVar21 + 1;
          } while (local_c0 != uVar21);
        }
        if ((int)uVar20 != 0) {
          uVar21 = 0;
          do {
            uVar22 = (int)uVar20 - 1;
            uVar20 = (ulong)uVar22;
            uVar12 = (ulong)*(uint *)((long)__ptr + uVar20 * 4);
            bVar18 = *(byte *)((long)__s_00 + uVar12);
            uVar16 = uVar21;
            if ((bVar18 & 0xfc) == 4) {
              uVar12 = *(ulong *)((long)__s_01 + uVar12 * 8);
              auVar6._8_8_ = 0;
              auVar6._0_8_ = uVar12;
              local_d8[3] = SUB164(ZEXT416(local_b8->SegmentCountLength) * auVar6,8);
              local_d8[1] = (uint)(uVar12 >> 0x12) & local_b8->SegmentLengthMask & 0x3ffff ^
                            local_d8[3] + local_b8->SegmentLength;
              local_d8[2] = local_b8->SegmentLengthMask & (uint)uVar12 ^
                            local_d8[3] + local_b8->SegmentLength * 2;
              local_c8 = local_d8[1];
              uVar23 = bVar18 & 3;
              uVar16 = (ulong)((int)uVar21 + 1);
              uVar17 = (ulong)local_d8[(ulong)uVar23 + 1];
              bVar18 = *(byte *)((long)__s_00 + uVar17);
              bVar9 = (byte)uVar23;
              *(uint *)((long)__ptr + uVar20 * 4) = local_d8[(ulong)uVar23 + 1];
              uVar22 = uVar22 + ((bVar18 & 0xfc) == 8);
              bVar24 = bVar9 - 2;
              if (bVar9 < 2) {
                bVar24 = bVar9 + 1;
              }
              *(byte *)((long)__ptr_00 + uVar21) = bVar9;
              *(ulong *)((long)__s + uVar21 * 8) = uVar12;
              puVar1 = (ulong *)((long)__s_01 + uVar17 * 8);
              *puVar1 = *puVar1 ^ uVar12;
              *(byte *)((long)__s_00 + uVar17) = bVar24 ^ bVar18 - 4;
              uVar20 = (ulong)local_d8[uVar23 + 2];
              bVar18 = *(byte *)((long)__s_00 + uVar20);
              *(uint *)((long)__ptr + (ulong)uVar22 * 4) = local_d8[uVar23 + 2];
              bVar9 = (char)(uVar23 + 2) - 3;
              if ((ulong)uVar23 == 0) {
                bVar9 = 2;
              }
              *(byte *)((long)__s_00 + uVar20) = bVar9 ^ bVar18 - 4;
              puVar1 = (ulong *)((long)__s_01 + uVar20 * 8);
              *puVar1 = *puVar1 ^ uVar12;
              uVar20 = (ulong)(((bVar18 & 0xfc) == 8) + uVar22);
            }
            uVar21 = uVar16;
          } while ((int)uVar20 != 0);
        }
        if ((int)uVar16 + (int)local_b0 != (int)local_f8) {
          iVar10 = 0;
          if ((int)local_b0 != 0) {
            local_f8 = binary_fuse_sort_and_remove_dup(local_90,uVar13);
          }
          goto LAB_001067e4;
        }
        iVar10 = 4;
        bVar8 = true;
        local_f8 = uVar16;
      }
      else {
LAB_001067e4:
        bVar8 = false;
        memset(__s,0,(local_f8 & 0xffffffff) << 3);
        memset(__s_00,0,local_c0);
        memset(__s_01,0,local_80);
        local_88 = local_88 + 0x9e3779b97f4a7c15;
        uVar13 = (local_88 >> 0x1e ^ local_88) * -0x40a7b892e31b1a47;
        uVar13 = (uVar13 >> 0x1b ^ uVar13) * -0x6b2fb644ecceee15;
        local_b8->Seed = uVar13 >> 0x1f ^ uVar13;
        auVar31 = local_48;
        auVar29 = _DAT_00107060;
      }
      if ((iVar10 != 6) && (iVar10 != 0)) {
        if (!bVar8) {
          return false;
        }
        _Var14 = true;
        uVar27 = (uint)local_f8;
        if (uVar27 != 0) {
          uVar19 = uVar27 - 1;
          uVar2 = local_b8->SegmentLength;
          uVar22 = local_b8->SegmentLengthMask;
          puVar4 = local_b8->Fingerprints;
          uVar23 = local_b8->SegmentCountLength;
          do {
            uVar13 = *(ulong *)((long)__s + (ulong)uVar19 * 8);
            uVar16 = (ulong)*(byte *)((long)__ptr_00 + (ulong)uVar19);
            auVar7._8_8_ = 0;
            auVar7._0_8_ = uVar13;
            local_d8[0] = SUB164(ZEXT416(uVar23) * auVar7,8);
            local_d8[1] = (uint)(uVar13 >> 0x12) & uVar22 & 0x3ffff ^ local_d8[0] + uVar2;
            local_d8[2] = (uint)uVar13 & uVar22 ^ uVar2 * 2 + local_d8[0];
            local_d8[3] = local_d8[0];
            local_c8 = local_d8[1];
            puVar4[local_d8[uVar16]] =
                 (ushort)(uVar13 >> 0x20) ^ (ushort)uVar13 ^ puVar4[local_d8[uVar16 + 1]] ^
                 puVar4[local_d8[uVar16 + 2]];
            uVar19 = uVar19 - 1;
          } while (uVar19 < uVar27);
          _Var14 = true;
          __ptr = local_98;
        }
        goto LAB_001068c3;
      }
      iVar10 = local_9c + 1;
    } while (iVar10 != 0x65);
    _Var14 = false;
  }
LAB_001068c3:
  free(__ptr);
  free(__s_00);
  free(__ptr_00);
  free(__s_01);
  free(__s);
  free(__ptr_01);
  return _Var14;
}

Assistant:

static inline bool binary_fuse16_populate(uint64_t *keys, uint32_t size,
                           binary_fuse16_t *filter) {
  if (size != filter->Size) {
    return false;
  }

  uint64_t rng_counter = 0x726b2b9d438b9d4d;
  filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
  uint64_t *reverseOrder = (uint64_t *)calloc((size + 1), sizeof(uint64_t));
  uint32_t capacity = filter->ArrayLength;
  uint32_t *alone = (uint32_t *)malloc(capacity * sizeof(uint32_t));
  uint8_t *t2count = (uint8_t *)calloc(capacity, sizeof(uint8_t));
  uint8_t *reverseH = (uint8_t *)malloc(size * sizeof(uint8_t));
  uint64_t *t2hash = (uint64_t *)calloc(capacity, sizeof(uint64_t));

  uint32_t blockBits = 1;
  while (((uint32_t)1 << blockBits) < filter->SegmentCount) {
    blockBits += 1;
  }
  uint32_t block = ((uint32_t)1 << blockBits);
  uint32_t *startPos = (uint32_t *)malloc((1U << blockBits) * sizeof(uint32_t));
  uint32_t h012[5];

  if ((alone == NULL) || (t2count == NULL) || (reverseH == NULL) ||
      (t2hash == NULL) || (reverseOrder == NULL) || (startPos == NULL)) {
    free(alone);
    free(t2count);
    free(reverseH);
    free(t2hash);
    free(reverseOrder);
    free(startPos);
    return false;
  }
  reverseOrder[size] = 1;
  for (int loop = 0; true; ++loop) {
    if (loop + 1 > XOR_MAX_ITERATIONS) {
      // The probability of this happening is lower than the
      // the cosmic-ray probability (i.e., a cosmic ray corrupts your system).
      free(alone);
      free(t2count);
      free(reverseH);
      free(t2hash);
      free(reverseOrder);
      free(startPos);
      return false;
    }

    for (uint32_t i = 0; i < block; i++) {
      // important : i * size would overflow as a 32-bit number in some
      // cases.
      startPos[i] = (uint32_t)(((uint64_t)i * size) >> blockBits);
    }

    uint64_t maskblock = block - 1;
    for (uint32_t i = 0; i < size; i++) {
      uint64_t hash = binary_fuse_murmur64(keys[i] + filter->Seed);
      uint64_t segment_index = hash >> (64 - blockBits);
      while (reverseOrder[startPos[segment_index]] != 0) {
        segment_index++;
        segment_index &= maskblock;
      }
      reverseOrder[startPos[segment_index]] = hash;
      startPos[segment_index]++;
    }
    int error = 0;
    uint32_t duplicates = 0;
    for (uint32_t i = 0; i < size; i++) {
      uint64_t hash = reverseOrder[i];
      uint32_t h0 = binary_fuse16_hash(0, hash, filter);
      t2count[h0] += 4;
      t2hash[h0] ^= hash;
      uint32_t h1= binary_fuse16_hash(1, hash, filter);
      t2count[h1] += 4;
      t2count[h1] ^= 1U;
      t2hash[h1] ^= hash;
      uint32_t h2 = binary_fuse16_hash(2, hash, filter);
      t2count[h2] += 4;
      t2hash[h2] ^= hash;
      t2count[h2] ^= 2U;
      if ((t2hash[h0] & t2hash[h1] & t2hash[h2]) == 0) {
        if   (((t2hash[h0] == 0) && (t2count[h0] == 8))
          ||  ((t2hash[h1] == 0) && (t2count[h1] == 8))
          ||  ((t2hash[h2] == 0) && (t2count[h2] == 8))) {
					duplicates += 1;
 					t2count[h0] -= 4;
 					t2hash[h0] ^= hash;
 					t2count[h1] -= 4;
 					t2count[h1] ^= 1U;
 					t2hash[h1] ^= hash;
 					t2count[h2] -= 4;
 					t2count[h2] ^= 2U;
 					t2hash[h2] ^= hash;
        }
      }
      error = (t2count[h0] < 4) ? 1 : error;
      error = (t2count[h1] < 4) ? 1 : error;
      error = (t2count[h2] < 4) ? 1 : error;
    }
    if(error) {
      memset(reverseOrder, 0, sizeof(uint64_t) * size);
      memset(t2count, 0, sizeof(uint8_t) * capacity);
      memset(t2hash, 0, sizeof(uint64_t) * capacity);
      filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
      continue;
    }

    // End of key addition
    uint32_t Qsize = 0;
    // Add sets with one key to the queue.
    for (uint32_t i = 0; i < capacity; i++) {
      alone[Qsize] = i;
      Qsize += ((t2count[i] >> 2U) == 1) ? 1U : 0U;
    }
    uint32_t stacksize = 0;
    while (Qsize > 0) {
      Qsize--;
      uint32_t index = alone[Qsize];
      if ((t2count[index] >> 2U) == 1) {
        uint64_t hash = t2hash[index];

        //h012[0] = binary_fuse16_hash(0, hash, filter);
        h012[1] = binary_fuse16_hash(1, hash, filter);
        h012[2] = binary_fuse16_hash(2, hash, filter);
        h012[3] = binary_fuse16_hash(0, hash, filter); // == h012[0];
        h012[4] = h012[1];
        uint8_t found = t2count[index] & 3U;
        reverseH[stacksize] = found;
        reverseOrder[stacksize] = hash;
        stacksize++;
        uint32_t other_index1 = h012[found + 1];
        alone[Qsize] = other_index1;
        Qsize += ((t2count[other_index1] >> 2U) == 2 ? 1U : 0U);

        t2count[other_index1] -= 4;
        t2count[other_index1] ^= binary_fuse_mod3(found + 1);
        t2hash[other_index1] ^= hash;

        uint32_t other_index2 = h012[found + 2];
        alone[Qsize] = other_index2;
        Qsize += ((t2count[other_index2] >> 2U) == 2 ? 1U : 0U);
        t2count[other_index2] -= 4;
        t2count[other_index2] ^= binary_fuse_mod3(found + 2);
        t2hash[other_index2] ^= hash;
      }
    }
    if (stacksize + duplicates == size) {
      // success
      size = stacksize;
      break;
    }
    if(duplicates > 0) {
      size = (uint32_t)binary_fuse_sort_and_remove_dup(keys, size);
    }
    memset(reverseOrder, 0, sizeof(uint64_t) * size);
    memset(t2count, 0, sizeof(uint8_t) * capacity);
    memset(t2hash, 0, sizeof(uint64_t) * capacity);
    filter->Seed = binary_fuse_rng_splitmix64(&rng_counter);
  }

  for (uint32_t i = size - 1; i < size; i--) {
    // the hash of the key we insert next
    uint64_t hash = reverseOrder[i];
    uint16_t xor2 = binary_fuse16_fingerprint(hash);
    uint8_t found = reverseH[i];
    h012[0] = binary_fuse16_hash(0, hash, filter);
    h012[1] = binary_fuse16_hash(1, hash, filter);
    h012[2] = binary_fuse16_hash(2, hash, filter);
    h012[3] = h012[0];
    h012[4] = h012[1];
    filter->Fingerprints[h012[found]] = (uint16_t)(
        (uint32_t)xor2 ^
        (uint32_t)filter->Fingerprints[h012[found + 1]] ^
        (uint32_t)filter->Fingerprints[h012[found + 2]]);
  }
  free(alone);
  free(t2count);
  free(reverseH);
  free(t2hash);
  free(reverseOrder);
  free(startPos);
  return true;
}